

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

void uv__run_timers(uv_loop_t *loop)

{
  uint64_t timeout;
  long *plVar1;
  long *plVar2;
  long *local_28;
  long *local_20;
  
  local_28 = (long *)&local_28;
  plVar2 = (long *)(loop->timer_heap).min;
  local_20 = (long *)&local_28;
  while ((plVar1 = plVar2, plVar1 != (long *)0x0 && ((ulong)plVar1[3] <= loop->time))) {
    uv_timer_stop((uv_timer_t *)(plVar1 + -9));
    *plVar1 = (long)&local_28;
    plVar1[1] = (long)local_20;
    *local_20 = (long)plVar1;
    local_20 = plVar1;
    plVar2 = (long *)(loop->timer_heap).min;
  }
  while (plVar2 = local_28, (long **)local_28 != &local_28) {
    *(long *)local_28[1] = *local_28;
    *(long *)(*local_28 + 8) = local_28[1];
    *local_28 = (long)local_28;
    plVar2[1] = (long)plVar2;
    if (((uv_timer_cb)plVar2[-1] != (uv_timer_cb)0x0) && (timeout = plVar2[4], timeout != 0)) {
      uv_timer_start((uv_timer_t *)(plVar2 + -9),(uv_timer_cb)plVar2[-1],timeout,timeout);
    }
    (*(code *)plVar2[-1])((uv_timer_t *)(plVar2 + -9));
  }
  return;
}

Assistant:

void uv__run_timers(uv_loop_t* loop) {
  struct heap_node* heap_node;
  uv_timer_t* handle;
  struct uv__queue* queue_node;
  struct uv__queue ready_queue;

  uv__queue_init(&ready_queue);

  for (;;) {
    heap_node = heap_min((struct heap*) &loop->timer_heap);
    if (heap_node == NULL)
      break;

    handle = container_of(heap_node, uv_timer_t, node.heap);
    if (handle->timeout > loop->time)
      break;

    uv_timer_stop(handle);
    uv__queue_insert_tail(&ready_queue, &handle->node.queue);
  }

  while (!uv__queue_empty(&ready_queue)) {
    queue_node = uv__queue_head(&ready_queue);
    uv__queue_remove(queue_node);
    uv__queue_init(queue_node);
    handle = container_of(queue_node, uv_timer_t, node.queue);

    uv_timer_again(handle);
    handle->timer_cb(handle);
  }
}